

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O1

void __thiscall V2Comp::set(V2Comp *this,syVComp *para)

{
  int iVar1;
  int i;
  long lVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  
  if ((uint)(int)para->mode < 3) {
    iVar1 = this->mode;
    this->mode = *(int *)(&DAT_0010e320 + (ulong)(uint)(int)para->mode * 4);
    if ((para->stereo != 0.0) || (NAN(para->stereo))) {
      *(byte *)&this->mode = (byte)this->mode | 2;
    }
    if (this->mode != iVar1) {
      lVar2 = 0;
      do {
        this->peakval[lVar2] = 0.0;
        this->rmsval[lVar2] = 0.0;
        this->curgain[lVar2] = 1.0;
        lVar2 = lVar2 + 1;
      } while (lVar2 == 1);
      memset(this->rmsbuf,0,0x10000);
      this->rmscnt = 0;
    }
    this->dblen = (int)(para->lookahead * this->inst->SRfcsamplesperms);
    fVar4 = exp2f((para->threshold * 0.0078125 + -1.0) * 10.0);
    this->invol = 1.0 / (fVar4 * 8.0);
    uVar3 = -(uint)(para->autogain != 0.0);
    fVar5 = exp2f((para->outgain + -64.0) * 0.0625);
    this->outvol = fVar5 * (float)(uVar3 & 0x3f800000 | ~uVar3 & (uint)(fVar4 * 8.0));
    this->ratio = para->ratio * 0.0078125;
    fVar4 = exp2f(para->attack * -12.0 * 0.0078125);
    this->attack = fVar4;
    fVar4 = exp2f(para->release * -16.0 * 0.0078125);
    this->release = fVar4;
    return;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/jgilje[P]v2m-player/src/synth_core.cpp"
                ,0x861,"void V2Comp::set(const syVComp *)");
}

Assistant:

void set(const syVComp *para)
    {
        int oldmode = mode;
        switch ((int)para->mode)
        {
        case MODE_OFF:  mode = MODE_BIT_OFF; break;
        case MODE_PEAK: mode = MODE_BIT_PEAK | MODE_BIT_ON; break;
        case MODE_RMS:  mode = MODE_BIT_RMS | MODE_BIT_ON; break;
        default:        assert(false);
        }

        if (para->stereo != 0.0f)
            mode |= MODE_BIT_STEREO;

        if (mode != oldmode)
            reset();

        // @@@BUG: original V2 code uses "fcsamplesperms" here which is
        // hard-coded to 44.1kHz
        dblen = (int)(para->lookahead * inst->SRfcsamplesperms);

        float thresh = 8.0f * calcfreq(para->threshold / 128.0f);
        invol = 1.0f / thresh;
        if (para->autogain != 0.0f)
            thresh = 1.0f;
        outvol = thresh * powf(2.0f, (para->outgain - 64.0f) / 16.0f);
        ratio = para->ratio / 128.0f;

        // attack: 0 (!) ... 200ms (5Hz)
        attack = powf(2.0f, -para->attack * 12.0f / 128.0f);
        // release: 5ms .. 5s
        release = powf(2.0f, -para->release * 16.0f / 128.0f);
    }